

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestNamerTests.cpp
# Opt level: O0

Utest * __thiscall
TEST_NamerTestGroup_ItCanGiveYouTheTestDirectory_TestShell::createTest
          (TEST_NamerTestGroup_ItCanGiveYouTheTestDirectory_TestShell *this)

{
  Utest *this_00;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  this_00 = (Utest *)operator_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0x11993f);
  TEST_NamerTestGroup_ItCanGiveYouTheTestDirectory_Test::
  TEST_NamerTestGroup_ItCanGiveYouTheTestDirectory_Test
            ((TEST_NamerTestGroup_ItCanGiveYouTheTestDirectory_Test *)this_00);
  return this_00;
}

Assistant:

TEST(NamerTestGroup, ItCanGiveYouTheTestDirectory)
{
    // This should work with CaseSensitive::Yes.
    // However, it would fail when run in Visual Studio 2017 as lower-case source-file names are returned.
    // We've fixed this for filenames, but not directory names, so this test ignores case.
    // See https://stackoverflow.com/questions/49068785/how-to-find-the-filename-from-a-c11-stat-objects-file-serial-number-on-window
    auto suppress_subdirectory = Approvals::useApprovalsSubdirectory("");
    ApprovalTestNamer namer;
    auto sep = SystemUtils::getDirectorySeparator();
    checkEndsWithIgnoringCase(namer.getDirectory(),
                              sep + "CppUTest_Tests" + sep + "namers" + sep);
}